

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O2

void xercesc_4_0::XMLBigDecimal::parseDecimal(XMLCh *toParse,MemoryManager *manager)

{
  XMLCh *pXVar1;
  ushort uVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  XMLSize_t XVar6;
  NumberFormatException *this;
  XMLCh *pXVar7;
  short *psVar8;
  long lVar9;
  long lVar10;
  short *psVar11;
  XMLCh *pXVar12;
  
  lVar9 = -2;
  do {
    lVar10 = lVar9;
    uVar2 = *(ushort *)((long)toParse + lVar10 + 2);
    lVar9 = lVar10 + 2;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar2] < '\0');
  if (uVar2 == 0) {
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
               ,0x143,XMLNUM_WSString,manager);
  }
  else {
    psVar8 = (short *)((long)toParse + lVar10 + 4);
    XVar6 = XMLString::stringLen(toParse);
    pXVar7 = toParse + XVar6 + 1;
    lVar10 = lVar9 + XVar6 * -2;
    do {
      pXVar12 = pXVar7 + -2;
      pXVar7 = pXVar7 + -1;
      lVar10 = lVar10 + 2;
    } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar12] < '\0');
    sVar3 = *(short *)((long)toParse + lVar9);
    if (sVar3 == 0x2b) {
      psVar11 = psVar8;
      if (lVar10 == 0) {
        this = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                   ,0x15a,XMLNUM_Inv_chars,manager);
        goto LAB_002612ed;
      }
    }
    else {
      psVar11 = (short *)((long)toParse + lVar9);
      if ((sVar3 == 0x2d) && (psVar11 = psVar8, lVar10 == 0)) {
        this = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                   ,0x152,XMLNUM_Inv_chars,manager);
        goto LAB_002612ed;
      }
    }
    pXVar12 = psVar11 + -1;
    do {
      pXVar1 = pXVar12 + 1;
      pXVar12 = pXVar12 + 1;
    } while (*pXVar1 == L'0');
    if (pXVar7 <= pXVar12) {
      return;
    }
    bVar5 = false;
    do {
      while( true ) {
        if (pXVar7 <= pXVar12) {
          return;
        }
        if (*pXVar12 == L'.') break;
        if ((ushort)(*pXVar12 + L'ￆ') < 0xfff6) {
          this = (NumberFormatException *)__cxa_allocate_exception(0x30);
          NumberFormatException::NumberFormatException
                    (this,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                     ,0x17b,XMLNUM_Inv_chars,manager);
          goto LAB_002612ed;
        }
        pXVar12 = pXVar12 + 1;
      }
      pXVar12 = pXVar12 + 1;
      bVar4 = !bVar5;
      bVar5 = true;
    } while (bVar4);
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
               ,0x176,XMLNUM_2ManyDecPoint,manager);
  }
LAB_002612ed:
  __cxa_throw(this,&NumberFormatException::typeinfo,XMLException::~XMLException);
}

Assistant:

void  XMLBigDecimal::parseDecimal(const XMLCh*         const toParse
                               ,        MemoryManager* const manager)
{

    // Strip leading white space, if any. 
    const XMLCh* startPtr = toParse;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    // If we hit the end, then return failure
    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Strip tailing white space, if any.
    const XMLCh* endPtr = toParse + XMLString::stringLen(toParse);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    // '+' or '-' is allowed only at the first position
    // and is NOT included in the return parsed string

    if (*startPtr == chDash)
    {
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }

    // Strip leading zeros
    while (*startPtr == chDigit_0)
        startPtr++;

    // containning zero, only zero, nothing but zero
    // it is a zero, indeed
    if (startPtr >= endPtr)
    {
        return;
    }

    // Scan data
    bool   dotSignFound = false;
    while (startPtr < endPtr)
    {
        if (*startPtr == chPeriod)
        {
            if (!dotSignFound)
            {
                dotSignFound = true;
                startPtr++;
                continue;
            }
            else  // '.' is allowed only once
                ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_2ManyDecPoint, manager);
        }

        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        startPtr++;

    }

    return;
}